

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mem.c
# Opt level: O3

SHOP_DATA * new_shop(void)

{
  SHOP_DATA *pSVar1;
  
  pSVar1 = (SHOP_DATA *)operator_new(0x20);
  pSVar1->pMobIndex = (MOB_INDEX_DATA *)0x0;
  pSVar1->open_hour = 0;
  pSVar1->close_hour = 0;
  pSVar1->direction = 0;
  *(undefined2 *)&pSVar1->field_0x1e = 0;
  pSVar1->fIsPetShop = false;
  *(undefined3 *)&pSVar1->field_0x1 = 0;
  pSVar1->pet_cage_vnum = 0;
  pSVar1->next = (SHOP_DATA *)0x0;
  pSVar1->close_hour = 0x17;
  return pSVar1;
}

Assistant:

SHOP_DATA *new_shop(void)
{
	SHOP_DATA *pShop = new SHOP_DATA;

	CLEAR_MEM(pShop, sizeof(SHOP_DATA))

	pShop->open_hour = 0;
	pShop->close_hour = 23;
	pShop->direction = 0;

	return pShop;
}